

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.cc
# Opt level: O2

void __thiscall CoreML::Specification::Metadata::SharedDtor(Metadata *this)

{
  ulong uVar1;
  undefined8 *puVar2;
  LogMessage *other;
  LogFinisher local_49;
  LogMessage local_48;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  puVar2 = (undefined8 *)(uVar1 & 0xfffffffffffffffc);
  if ((uVar1 & 1) != 0) {
    puVar2 = (undefined8 *)*puVar2;
  }
  if (puVar2 != (undefined8 *)0x0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_48,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/build_O2/mlmodel/format/Model.pb.cc"
               ,0x487);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_48,"CHECK failed: GetArenaForAllocation() == nullptr: ");
    google::protobuf::internal::LogFinisher::operator=(&local_49,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_48);
  }
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->shortdescription_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->versionstring_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->author_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (&this->license_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
  return;
}

Assistant:

inline void Metadata::SharedDtor() {
  GOOGLE_DCHECK(GetArenaForAllocation() == nullptr);
  shortdescription_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  versionstring_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  author_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  license_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}